

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5DecodeFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  void *pvVar1;
  long lVar2;
  ushort *puVar3;
  u8 *pStruct;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  void *__src;
  long lVar15;
  char *pcVar16;
  int i;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  int rc;
  int nKeep;
  ulong local_b8;
  ushort *local_b0;
  Fts5Buffer s;
  uint local_90;
  Fts5Buffer term;
  int nIncr;
  int nAppend;
  ulong local_50;
  sqlite3_context *local_48;
  int iTermOff;
  undefined4 local_38;
  
  rc = 0;
  pvVar1 = pCtx->pFunc->pUserData;
  s.p = (u8 *)0x0;
  s.n = 0;
  s.nSpace = 0;
  local_48 = pCtx;
  uVar14 = sqlite3VdbeIntValue(*apVal);
  uVar9 = sqlite3_value_bytes(apVal[1]);
  __src = sqlite3_value_blob(apVal[1]);
  local_b8 = (ulong)uVar9;
  local_b0 = (ushort *)sqlite3Fts5MallocZero(&rc,(long)(int)(uVar9 + 8));
  iVar10 = rc;
  if (local_b0 == (ushort *)0x0) goto LAB_001bffe1;
  if (0 < (int)local_b8) {
    memcpy(local_b0,__src,local_b8 & 0xffffffff);
  }
  uVar18 = uVar14 >> 0x24;
  uVar9 = (uint)(uVar14 >> 0x25) & 0xffff;
  if (uVar9 == 0) {
    if (uVar14 == 1) {
      sqlite3Fts5BufferAppendPrintf(&rc,&s,"{averages} ");
      if ((uVar18 & 1) == 0) {
        pcVar16 = "";
        for (uVar9 = 0; iVar10 = rc, (int)uVar9 < (int)(uint)local_b8; uVar9 = uVar9 + bVar6) {
          bVar6 = sqlite3Fts5GetVarint((uchar *)((ulong)uVar9 + (long)local_b0),(u64 *)&term);
          sqlite3Fts5BufferAppendPrintf(&rc,&s,"%s%d",pcVar16,(ulong)term.p & 0xffffffff);
          pcVar16 = " ";
        }
        goto LAB_001bffe1;
      }
    }
    else {
      sqlite3Fts5BufferAppendPrintf(&rc,&s,"{structure}");
      if ((uVar18 & 1) == 0) {
        term.p = (u8 *)0x0;
        iVar10 = fts5StructureDecode((u8 *)local_b0,(int)local_b8,(int *)0x0,(Fts5Structure **)&term
                                    );
        pStruct = term.p;
        if (iVar10 == 0) {
          uVar14 = 0;
          while ((long)uVar14 < (long)*(int *)(pStruct + 0x14)) {
            lVar15 = uVar14 * 0x10;
            local_b8 = uVar14;
            sqlite3Fts5BufferAppendPrintf
                      (&rc,&s," {lvl=%d nMerge=%d nSeg=%d",uVar14,
                       (ulong)*(uint *)(pStruct + lVar15 + 0x18),
                       (ulong)*(uint *)(pStruct + lVar15 + 0x1c));
            lVar19 = 8;
            for (lVar22 = 0; lVar22 < *(int *)(pStruct + lVar15 + 0x1c); lVar22 = lVar22 + 1) {
              lVar2 = *(long *)(pStruct + lVar15 + 0x20);
              sqlite3Fts5BufferAppendPrintf
                        (&rc,&s," {id=%d leaves=%d..%d}",(ulong)*(uint *)(lVar2 + -8 + lVar19),
                         (ulong)*(uint *)(lVar2 + -4 + lVar19),(ulong)*(uint *)(lVar2 + lVar19));
              lVar19 = lVar19 + 0xc;
            }
            sqlite3Fts5BufferAppendPrintf(&rc,&s,"}");
            uVar14 = local_b8 + 1;
          }
          fts5StructureRelease((Fts5Structure *)pStruct);
          iVar10 = rc;
        }
        goto LAB_001bffe1;
      }
    }
  }
  else {
    pcVar16 = "dlidx ";
    if ((uVar14 >> 0x24 & 1) == 0) {
      pcVar16 = "";
    }
    sqlite3Fts5BufferAppendPrintf
              (&rc,&s,"{%ssegid=%d h=%d pgno=%d}",pcVar16,(ulong)uVar9,
               (ulong)((uint)(uVar14 >> 0x1f) & 0x1f),(uint)uVar14 & 0x7fffffff);
    if ((uVar18 & 1) == 0) {
      if (pvVar1 == (void *)0x0) {
        _iTermOff = (ushort *)((ulong)_iTermOff & 0xffffffff00000000);
        term.p = (u8 *)0x0;
        term.n = 0;
        term.nSpace = 0;
        if ((int)(uint)local_b8 < 4) {
          sqlite3Fts5BufferSet(&rc,&s,7,(u8 *)"corrupt");
          iVar10 = rc;
          goto LAB_001bffe1;
        }
        uVar7 = *local_b0;
        uVar8 = local_b0[1] << 8 | local_b0[1] >> 8;
        if (uVar8 < (uint)local_b8) {
          sqlite3Fts5GetVarint32((uchar *)((long)local_b0 + (ulong)uVar8),(u32 *)&iTermOff);
          uVar9 = iTermOff;
          if (iTermOff == 0) {
            uVar9 = (uint)uVar8;
          }
LAB_001bfe2b:
          puVar3 = local_b0;
          uVar14 = local_b8;
          uVar7 = uVar7 << 8 | uVar7 >> 8;
          uVar17 = (uint)uVar7;
          if (uVar7 == 0) {
            uVar17 = uVar9;
          }
          iVar10 = (int)local_b8;
          if (((int)uVar17 <= iVar10) &&
             (local_50 = (ulong)uVar8, fts5DecodePoslist(&rc,&s,(u8 *)(local_b0 + 2),uVar17 - 4),
             (int)uVar9 <= iVar10)) {
            fts5DecodeDoclist(&rc,&s,(u8 *)((long)(int)uVar17 + (long)puVar3),uVar9 - uVar17);
            iVar10 = 0;
            uVar18 = local_50 & 0xffffffff;
            lVar19 = 0;
            while( true ) {
              uVar4 = local_50;
              iVar11 = (int)uVar18;
              if (((int)uVar14 <= iVar11) || (rc != 0)) goto LAB_001bffd7;
              iVar12 = sqlite3Fts5GetVarint32((uchar *)(uVar18 + (long)local_b0),(u32 *)&nKeep);
              uVar9 = iVar12 + iVar11;
              lVar19 = (long)(int)lVar19 + (long)nKeep;
              iVar21 = (int)uVar4;
              iVar13 = (int)lVar19;
              iVar12 = iVar21;
              if ((int)uVar9 < (int)uVar14) break;
LAB_001bff06:
              puVar3 = local_b0;
              if (iVar11 != iVar21) {
                iVar11 = sqlite3Fts5GetVarint32((uchar *)(lVar19 + (long)local_b0),(u32 *)&nKeep);
                if (iVar10 < nKeep) goto LAB_001bffcf;
                iVar13 = iVar11 + iVar13;
                term.n = nKeep;
              }
              iVar10 = sqlite3Fts5GetVarint32((uchar *)((long)puVar3 + (long)iVar13),(u32 *)&nKeep);
              iVar11 = nKeep + iVar13 + iVar10;
              if ((int)(uint)local_b8 < iVar11) goto LAB_001bffcf;
              sqlite3Fts5BufferAppendBlob
                        (&rc,&term,nKeep,(u8 *)((long)(iVar13 + iVar10) + (long)puVar3));
              iVar10 = term.n;
              sqlite3Fts5BufferAppendPrintf(&rc,&s," term=%.*s",term._8_8_ & 0xffffffff,term.p);
              fts5DecodeDoclist(&rc,&s,(u8 *)((long)iVar11 + (long)puVar3),iVar12 - iVar11);
              uVar18 = (ulong)uVar9;
              uVar14 = local_b8;
            }
            sqlite3Fts5GetVarint32((uchar *)((ulong)uVar9 + (long)local_b0),(u32 *)&nKeep);
            iVar12 = nKeep + iVar13;
            if (iVar12 <= iVar21) goto LAB_001bff06;
LAB_001bffcf:
            rc = 0x10b;
            goto LAB_001bffd7;
          }
        }
        else {
          uVar9 = (uint)uVar8;
          if (uVar8 <= (uint)local_b8) goto LAB_001bfe2b;
        }
        rc = 0x10b;
        iVar10 = rc;
      }
      else {
        uVar7 = local_b0[1] << 8 | local_b0[1] >> 8;
        nKeep = 0;
        term.p = (u8 *)0x0;
        term.n = 0;
        term.nSpace = 0;
        local_90 = (uint)uVar7;
        uVar17 = (uint)uVar7;
        uVar9 = local_90;
        if ((int)uVar17 < (int)(uint)local_b8) {
          iVar10 = sqlite3Fts5GetVarint32((uchar *)((long)local_b0 + (ulong)uVar7),(u32 *)&iTermOff)
          ;
          local_90 = iVar10 + (uint)uVar7;
          uVar9 = iTermOff;
        }
        puVar3 = local_b0;
        fts5DecodeRowidList(&rc,&s,(u8 *)(local_b0 + 2),uVar9 - 4);
        uVar20 = uVar9;
        while ((int)uVar20 < (int)uVar17) {
          iVar11 = sqlite3Fts5GetVarint32
                             ((uchar *)((long)(int)uVar20 + (long)puVar3),(u32 *)&nAppend);
          iVar10 = nAppend;
          term.n = nKeep;
          sqlite3Fts5BufferAppendBlob
                    (&rc,&term,nAppend,(u8 *)((long)(int)(iVar11 + uVar20) + (long)puVar3));
          sqlite3Fts5BufferAppendPrintf(&rc,&s," term=%.*s",term._8_8_ & 0xffffffff,term.p);
          uVar5 = uVar17;
          if ((int)local_90 < (int)(uint)local_b8) {
            iVar12 = sqlite3Fts5GetVarint32
                               ((uchar *)((long)(int)local_90 + (long)puVar3),(u32 *)&nIncr);
            local_90 = local_90 + iVar12;
            uVar5 = uVar9 + nIncr;
          }
          uVar9 = uVar5;
          iVar10 = iVar10 + iVar11 + uVar20;
          fts5DecodeRowidList(&rc,&s,(u8 *)((long)puVar3 + (long)iVar10),uVar9 - iVar10);
          uVar20 = uVar9;
          if ((int)uVar9 < (int)(uint)uVar7) {
            iVar10 = sqlite3Fts5GetVarint32
                               ((uchar *)((long)(int)uVar9 + (long)puVar3),(u32 *)&nKeep);
            uVar20 = iVar10 + uVar9;
          }
        }
LAB_001bffd7:
        sqlite3Fts5BufferFree(&term);
        iVar10 = rc;
      }
      goto LAB_001bffe1;
    }
  }
  term.p = (u8 *)&iTermOff;
  local_38 = (undefined4)local_b8;
  term.n = 0;
  term.nSpace = 0;
  _iTermOff = local_b0;
  fts5DlidxLvlNext((Fts5DlidxLvl *)&term);
  while (iVar10 = rc, term.nSpace == 0) {
    sqlite3Fts5BufferAppendPrintf(&rc,&s," %d(%lld)",uVar14 & 0x7fffffff,0);
    fts5DlidxLvlNext((Fts5DlidxLvl *)&term);
  }
LAB_001bffe1:
  rc = iVar10;
  sqlite3_free(local_b0);
  if (rc == 0) {
    sqlite3_result_text(local_48,(char *)s.p,s.n,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(local_48,rc);
  }
  sqlite3Fts5BufferFree(&s);
  return;
}

Assistant:

static void fts5DecodeFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  i64 iRowid;                     /* Rowid for record being decoded */
  int iSegid,iHeight,iPgno,bDlidx;/* Rowid components */
  const u8 *aBlob; int n;         /* Record to decode */
  u8 *a = 0;
  Fts5Buffer s;                   /* Build up text to return here */
  int rc = SQLITE_OK;             /* Return code */
  sqlite3_int64 nSpace = 0;
  int eDetailNone = (sqlite3_user_data(pCtx)!=0);

  assert( nArg==2 );
  UNUSED_PARAM(nArg);
  memset(&s, 0, sizeof(Fts5Buffer));
  iRowid = sqlite3_value_int64(apVal[0]);

  /* Make a copy of the second argument (a blob) in aBlob[]. The aBlob[]
  ** copy is followed by FTS5_DATA_ZERO_PADDING 0x00 bytes, which prevents
  ** buffer overreads even if the record is corrupt.  */
  n = sqlite3_value_bytes(apVal[1]);
  aBlob = sqlite3_value_blob(apVal[1]);
  nSpace = n + FTS5_DATA_ZERO_PADDING;
  a = (u8*)sqlite3Fts5MallocZero(&rc, nSpace);
  if( a==0 ) goto decode_out;
  if( n>0 ) memcpy(a, aBlob, n);

  fts5DecodeRowid(iRowid, &iSegid, &bDlidx, &iHeight, &iPgno);

  fts5DebugRowid(&rc, &s, iRowid);
  if( bDlidx ){
    Fts5Data dlidx;
    Fts5DlidxLvl lvl;

    dlidx.p = a;
    dlidx.nn = n;

    memset(&lvl, 0, sizeof(Fts5DlidxLvl));
    lvl.pData = &dlidx;
    lvl.iLeafPgno = iPgno;

    for(fts5DlidxLvlNext(&lvl); lvl.bEof==0; fts5DlidxLvlNext(&lvl)){
      sqlite3Fts5BufferAppendPrintf(&rc, &s, 
          " %d(%lld)", lvl.iLeafPgno, lvl.iRowid
      );
    }
  }else if( iSegid==0 ){
    if( iRowid==FTS5_AVERAGES_ROWID ){
      fts5DecodeAverages(&rc, &s, a, n);
    }else{
      fts5DecodeStructure(&rc, &s, a, n);
    }
  }else if( eDetailNone ){
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;
    int iPgidxOff = szLeaf = fts5GetU16(&a[2]);
    int iTermOff;
    int nKeep = 0;
    int iOff;

    memset(&term, 0, sizeof(Fts5Buffer));

    /* Decode any entries that occur before the first term. */
    if( szLeaf<n ){
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], iTermOff);
    }else{
      iTermOff = szLeaf;
    }
    fts5DecodeRowidList(&rc, &s, &a[4], iTermOff-4);

    iOff = iTermOff;
    while( iOff<szLeaf ){
      int nAppend;

      /* Read the term data for the next term*/
      iOff += fts5GetVarint32(&a[iOff], nAppend);
      term.n = nKeep;
      fts5BufferAppendBlob(&rc, &term, nAppend, &a[iOff]);
      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += nAppend;

      /* Figure out where the doclist for this term ends */
      if( iPgidxOff<n ){
        int nIncr;
        iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nIncr);
        iTermOff += nIncr;
      }else{
        iTermOff = szLeaf;
      }

      fts5DecodeRowidList(&rc, &s, &a[iOff], iTermOff-iOff);
      iOff = iTermOff;
      if( iOff<szLeaf ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }

    fts5BufferFree(&term);
  }else{
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;                   /* Offset of pgidx in a[] */
    int iPgidxOff;
    int iPgidxPrev = 0;           /* Previous value read from pgidx */
    int iTermOff = 0;
    int iRowidOff = 0;
    int iOff;
    int nDoclist;

    memset(&term, 0, sizeof(Fts5Buffer));

    if( n<4 ){
      sqlite3Fts5BufferSet(&rc, &s, 7, (const u8*)"corrupt");
      goto decode_out;
    }else{
      iRowidOff = fts5GetU16(&a[0]);
      iPgidxOff = szLeaf = fts5GetU16(&a[2]);
      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], iTermOff);
      }else if( iPgidxOff>n ){
        rc = FTS5_CORRUPT;
        goto decode_out;
      }
    }

    /* Decode the position list tail at the start of the page */
    if( iRowidOff!=0 ){
      iOff = iRowidOff;
    }else if( iTermOff!=0 ){
      iOff = iTermOff;
    }else{
      iOff = szLeaf;
    }
    if( iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodePoslist(&rc, &s, &a[4], iOff-4);

    /* Decode any more doclist data that appears on the page before the
    ** first term. */
    nDoclist = (iTermOff ? iTermOff : szLeaf) - iOff;
    if( nDoclist+iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodeDoclist(&rc, &s, &a[iOff], nDoclist);

    while( iPgidxOff<n && rc==SQLITE_OK ){
      int bFirst = (iPgidxOff==szLeaf);     /* True for first term on page */
      int nByte;                            /* Bytes of data */
      int iEnd;
      
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nByte);
      iPgidxPrev += nByte;
      iOff = iPgidxPrev;

      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], nByte);
        iEnd = iPgidxPrev + nByte;
      }else{
        iEnd = szLeaf;
      }
      if( iEnd>szLeaf ){
        rc = FTS5_CORRUPT;
        break;
      }

      if( bFirst==0 ){
        iOff += fts5GetVarint32(&a[iOff], nByte);
        if( nByte>term.n ){
          rc = FTS5_CORRUPT;
          break;
        }
        term.n = nByte;
      }
      iOff += fts5GetVarint32(&a[iOff], nByte);
      if( iOff+nByte>n ){
        rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferAppendBlob(&rc, &term, nByte, &a[iOff]);
      iOff += nByte;

      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += fts5DecodeDoclist(&rc, &s, &a[iOff], iEnd-iOff);
    }

    fts5BufferFree(&term);
  }
  
 decode_out:
  sqlite3_free(a);
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)s.p, s.n, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  fts5BufferFree(&s);
}